

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void shallue_van_de_woestijne(secp256k1_ge *ge,secp256k1_fe *t)

{
  uint uVar1;
  uint uVar2;
  uint flag;
  secp256k1_fe x3;
  secp256k1_fe local_2d8;
  secp256k1_fe wd;
  secp256k1_fe y3;
  secp256k1_fe x2;
  secp256k1_fe x3d;
  secp256k1_fe local_1f8;
  secp256k1_fe local_1c8;
  secp256k1_fe local_198;
  secp256k1_fe y2;
  secp256k1_fe y1;
  secp256k1_fe gammain;
  secp256k1_fe betain;
  secp256k1_fe alphain;
  secp256k1_fe x1;
  secp256k1_fe jinv;
  secp256k1_fe wn;
  
  secp256k1_fe_mul(&wn,&shallue_van_de_woestijne::c,t);
  secp256k1_fe_sqr(&wd,t);
  secp256k1_fe_add(&wd,&shallue_van_de_woestijne::b_plus_one);
  secp256k1_fe_mul(&local_2d8,t,&wn);
  local_2d8.n[0] = 0x3ffffbfffff0bc - local_2d8.n[0];
  local_2d8.n[1] = 0x3ffffffffffffc - local_2d8.n[1];
  local_2d8.n[2] = 0x3ffffffffffffc - local_2d8.n[2];
  local_2d8.n[3] = 0x3ffffffffffffc - local_2d8.n[3];
  local_2d8.n[4] = 0x3fffffffffffc - local_2d8.n[4];
  secp256k1_fe_mul(&local_198,&shallue_van_de_woestijne::d,&wd);
  local_198.n[0] = local_198.n[0] + local_2d8.n[0];
  local_198.n[1] = local_198.n[1] + local_2d8.n[1];
  local_198.n[2] = local_198.n[2] + local_2d8.n[2];
  local_198.n[3] = local_198.n[3] + local_2d8.n[3];
  local_198.n[4] = local_198.n[4] + local_2d8.n[4];
  local_1c8.n[0] = 0xbffff3ffffd234 - (local_198.n[0] + wd.n[0]);
  local_1c8.n[1] = 0xbffffffffffff4 - (local_198.n[1] + wd.n[1]);
  local_1c8.n[2] = 0xbffffffffffff4 - (local_198.n[2] + wd.n[2]);
  local_1c8.n[3] = 0xbffffffffffff4 - (local_198.n[3] + wd.n[3]);
  local_1c8.n[4] = 0xbfffffffffff4 - (local_198.n[4] + wd.n[4]);
  secp256k1_fe_mul(&x3d,&shallue_van_de_woestijne::c,t);
  secp256k1_fe_sqr(&x3d,&x3d);
  secp256k1_fe_sqr(&local_1f8,&wd);
  local_1f8.n[0] = local_1f8.n[0] + x3d.n[0];
  local_1f8.n[1] = local_1f8.n[1] + x3d.n[1];
  local_1f8.n[2] = local_1f8.n[2] + x3d.n[2];
  local_1f8.n[3] = local_1f8.n[3] + x3d.n[3];
  local_1f8.n[4] = local_1f8.n[4] + x3d.n[4];
  secp256k1_fe_mul(&jinv,&x3d,&wd);
  secp256k1_fe_inv(&jinv,&jinv);
  secp256k1_fe_mul(&x1,&local_198,&x3d);
  secp256k1_fe_mul(&x1,&x1,&jinv);
  secp256k1_fe_mul(&x2,&local_1c8,&x3d);
  secp256k1_fe_mul(&x2,&x2,&jinv);
  secp256k1_fe_mul(&x3,&local_1f8,&wd);
  secp256k1_fe_mul(&x3,&x3,&jinv);
  secp256k1_fe_sqr(&alphain,&x1);
  secp256k1_fe_mul(&alphain,&alphain,&x1);
  secp256k1_fe_add(&alphain,&shallue_van_de_woestijne::b);
  secp256k1_fe_sqr(&betain,&x2);
  secp256k1_fe_mul(&betain,&betain,&x2);
  secp256k1_fe_add(&betain,&shallue_van_de_woestijne::b);
  secp256k1_fe_sqr(&gammain,&x3);
  secp256k1_fe_mul(&gammain,&gammain,&x3);
  secp256k1_fe_add(&gammain,&shallue_van_de_woestijne::b);
  uVar1 = secp256k1_fe_sqrt(&y1,&alphain);
  uVar2 = secp256k1_fe_sqrt(&y2,&betain);
  secp256k1_fe_sqrt(&y3,&gammain);
  flag = (uVar1 ^ 1) & uVar2;
  secp256k1_fe_cmov(&x1,&x2,flag);
  secp256k1_fe_cmov(&y1,&y2,flag);
  uVar1 = ~uVar2 & (uVar1 ^ 1);
  secp256k1_fe_cmov(&x1,&x3,uVar1);
  secp256k1_fe_cmov(&y1,&y3,uVar1);
  ge->infinity = 0;
  (ge->x).n[0] = x1.n[0];
  (ge->x).n[1] = x1.n[1];
  (ge->x).n[2] = x1.n[2];
  (ge->x).n[3] = x1.n[3];
  (ge->x).n[4] = x1.n[4];
  (ge->y).n[0] = y1.n[0];
  (ge->y).n[1] = y1.n[1];
  (ge->y).n[2] = y1.n[2];
  (ge->y).n[3] = y1.n[3];
  (ge->y).n[4] = y1.n[4];
  secp256k1_fe_negate(&local_2d8,&ge->y,1);
  secp256k1_fe_cmov(&ge->y,&local_2d8,(uint)t->n[0] & 1);
  return;
}

Assistant:

static void shallue_van_de_woestijne(secp256k1_ge* ge, const secp256k1_fe* t) {
    /* Implements the algorithm from:
     *    Indifferentiable Hashing to Barreto-Naehrig Curves
     *    Pierre-Alain Fouque and Mehdi Tibouchi
     *    Latincrypt 2012
     */

    /* Basic algorithm:

       c = sqrt(-3)
       d = (c - 1)/2

       w = c * t / (1 + b + t^2)  [with b = 7]
       x1 = d - t*w
       x2 = -(x1 + 1)
       x3 = 1 + 1/w^2

       To avoid the 2 divisions, compute the above in numerator/denominator form:
       wn = c * t
       wd = 1 + 7 + t^2
       x1n = d*wd - t*wn
       x1d = wd
       x2n = -(x1n + wd)
       x2d = wd
       x3n = wd^2 + c^2 + t^2
       x3d = (c * t)^2

       The joint denominator j = wd * c^2 * t^2, and
       1 / x1d = 1/j * c^2 * t^2
       1 / x2d = x3d = 1/j * wd
    */

    static const secp256k1_fe c = SECP256K1_FE_CONST(0x0a2d2ba9, 0x3507f1df, 0x233770c2, 0xa797962c, 0xc61f6d15, 0xda14ecd4, 0x7d8d27ae, 0x1cd5f852);
    static const secp256k1_fe d = SECP256K1_FE_CONST(0x851695d4, 0x9a83f8ef, 0x919bb861, 0x53cbcb16, 0x630fb68a, 0xed0a766a, 0x3ec693d6, 0x8e6afa40);
    static const secp256k1_fe b = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 7);
    static const secp256k1_fe b_plus_one = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 8);

    secp256k1_fe wn, wd, x1n, x2n, x3n, x3d, jinv, tmp, x1, x2, x3, alphain, betain, gammain, y1, y2, y3;
    int alphaquad, betaquad;

    secp256k1_fe_mul(&wn, &c, t); /* mag 1 */
    secp256k1_fe_sqr(&wd, t); /* mag 1 */
    secp256k1_fe_add(&wd, &b_plus_one); /* mag 2 */
    secp256k1_fe_mul(&tmp, t, &wn); /* mag 1 */
    secp256k1_fe_negate(&tmp, &tmp, 1); /* mag 2 */
    secp256k1_fe_mul(&x1n, &d, &wd); /* mag 1 */
    secp256k1_fe_add(&x1n, &tmp); /* mag 3 */
    x2n = x1n; /* mag 3 */
    secp256k1_fe_add(&x2n, &wd); /* mag 5 */
    secp256k1_fe_negate(&x2n, &x2n, 5); /* mag 6 */
    secp256k1_fe_mul(&x3d, &c, t); /* mag 1 */
    secp256k1_fe_sqr(&x3d, &x3d); /* mag 1 */
    secp256k1_fe_sqr(&x3n, &wd); /* mag 1 */
    secp256k1_fe_add(&x3n, &x3d); /* mag 2 */
    secp256k1_fe_mul(&jinv, &x3d, &wd); /* mag 1 */
    secp256k1_fe_inv(&jinv, &jinv); /* mag 1 */
    secp256k1_fe_mul(&x1, &x1n, &x3d); /* mag 1 */
    secp256k1_fe_mul(&x1, &x1, &jinv); /* mag 1 */
    secp256k1_fe_mul(&x2, &x2n, &x3d); /* mag 1 */
    secp256k1_fe_mul(&x2, &x2, &jinv); /* mag 1 */
    secp256k1_fe_mul(&x3, &x3n, &wd); /* mag 1 */
    secp256k1_fe_mul(&x3, &x3, &jinv); /* mag 1 */

    secp256k1_fe_sqr(&alphain, &x1); /* mag 1 */
    secp256k1_fe_mul(&alphain, &alphain, &x1); /* mag 1 */
    secp256k1_fe_add(&alphain, &b); /* mag 2 */
    secp256k1_fe_sqr(&betain, &x2); /* mag 1 */
    secp256k1_fe_mul(&betain, &betain, &x2); /* mag 1 */
    secp256k1_fe_add(&betain, &b); /* mag 2 */
    secp256k1_fe_sqr(&gammain, &x3); /* mag 1 */
    secp256k1_fe_mul(&gammain, &gammain, &x3); /* mag 1 */
    secp256k1_fe_add(&gammain, &b); /* mag 2 */

    alphaquad = secp256k1_fe_sqrt(&y1, &alphain);
    betaquad = secp256k1_fe_sqrt(&y2, &betain);
    secp256k1_fe_sqrt(&y3, &gammain);

    secp256k1_fe_cmov(&x1, &x2, (!alphaquad) & betaquad);
    secp256k1_fe_cmov(&y1, &y2, (!alphaquad) & betaquad);
    secp256k1_fe_cmov(&x1, &x3, (!alphaquad) & !betaquad);
    secp256k1_fe_cmov(&y1, &y3, (!alphaquad) & !betaquad);

    secp256k1_ge_set_xy(ge, &x1, &y1);

    /* The linked algorithm from the paper uses the Jacobi symbol of t to
     * determine the Jacobi symbol of the produced y coordinate. Since the
     * rest of the algorithm only uses t^2, we can safely use another criterion
     * as long as negation of t results in negation of the y coordinate. Here
     * we choose to use t's oddness, as it is faster to determine. */
    secp256k1_fe_negate(&tmp, &ge->y, 1);
    secp256k1_fe_cmov(&ge->y, &tmp, secp256k1_fe_is_odd(t));
}